

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O0

char * vkt::sr::anon_unknown_0::getIntUniformName(int number)

{
  char *pcStack_10;
  int number_local;
  
  if (number == 0) {
    pcStack_10 = "ui_zero";
  }
  else if (number == 1) {
    pcStack_10 = "ui_one";
  }
  else if (number == 2) {
    pcStack_10 = "ui_two";
  }
  else if (number == 3) {
    pcStack_10 = "ui_three";
  }
  else if (number == 4) {
    pcStack_10 = "ui_four";
  }
  else if (number == 5) {
    pcStack_10 = "ui_five";
  }
  else if (number == 6) {
    pcStack_10 = "ui_six";
  }
  else if (number == 7) {
    pcStack_10 = "ui_seven";
  }
  else if (number == 8) {
    pcStack_10 = "ui_eight";
  }
  else if (number == 0x65) {
    pcStack_10 = "ui_oneHundredOne";
  }
  else {
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

static const char* getIntUniformName (int number)
{
	switch (number)
	{
		case 0:		return "ui_zero";
		case 1:		return "ui_one";
		case 2:		return "ui_two";
		case 3:		return "ui_three";
		case 4:		return "ui_four";
		case 5:		return "ui_five";
		case 6:		return "ui_six";
		case 7:		return "ui_seven";
		case 8:		return "ui_eight";
		case 101:	return "ui_oneHundredOne";
		default:
			DE_ASSERT(false);
			return "";
	}
}